

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

int Ssw_ManGetSatVarValue(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Aig_Obj_t *pAVar1;
  sat_solver *psVar2;
  uint uVar3;
  ulong uVar4;
  
  pAVar1 = p->pNodeToFrames[pObj->Id * p->nFrames + f];
  uVar4 = (ulong)pAVar1 & 0xfffffffffffffffe;
  uVar3 = Ssw_ObjSatNum((Ssw_Sat_t *)p->pMSat->vSatVars,(Aig_Obj_t *)(ulong)*(uint *)(uVar4 + 0x24))
  ;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    if (((int)uVar3 < 0) || (psVar2 = p->pMSat->pSat, psVar2->size <= (int)uVar3)) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0xda,"int sat_solver_var_value(sat_solver *, int)");
    }
    uVar3 = (uint)(psVar2->model[uVar3] == 1) ^ (uint)pAVar1 & 1;
  }
  if (p->pPars->fPolarFlip != 0) {
    uVar3 = uVar3 ^ *(uint *)(uVar4 + 0x18) >> 3 & 1;
  }
  return uVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Retrives value of the PI in the original AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ssw_ManGetSatVarValue( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    int fUseNoBoundary = 0;
    Aig_Obj_t * pObjFraig;
    int Value;
//    assert( Aig_ObjIsCi(pObj) );
    pObjFraig = Ssw_ObjFrame( p, pObj, f );
    if ( fUseNoBoundary )
    {
        Value = Ssw_CnfGetNodeValue( p->pMSat, Aig_Regular(pObjFraig) );
        Value ^= Aig_IsComplement(pObjFraig);
    }
    else
    {
        int nVarNum = Ssw_ObjSatNum( p->pMSat, Aig_Regular(pObjFraig) );
        Value = (!nVarNum)? 0 : (Aig_IsComplement(pObjFraig) ^ sat_solver_var_value( p->pMSat->pSat, nVarNum ));
    }

//    Value = (Aig_IsComplement(pObjFraig) ^ ((!nVarNum)? 0 : sat_solver_var_value( p->pSat, nVarNum )));
//    Value = (!nVarNum)? Aig_ManRandom(0) & 1 : (Aig_IsComplement(pObjFraig) ^ sat_solver_var_value( p->pSat, nVarNum ));
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_Regular(pObjFraig)->fPhase )  Value ^= 1;
    }
    return Value;
}